

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O1

void __thiscall DebugUtilsData::EndLabelRegion(DebugUtilsData *this,XrSession session)

{
  default_delete<XrSdkSessionLabel> *this_00;
  pointer puVar1;
  XrSdkSessionLabel *__ptr_00;
  XrSdkSessionLabelList *label_vec;
  pointer *__ptr;
  
  label_vec = GetSessionLabelList(this,session);
  if (label_vec != (XrSdkSessionLabelList *)0x0) {
    RemoveIndividualLabel(this,label_vec);
    puVar1 = (label_vec->
             super__Vector_base<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((label_vec->
        super__Vector_base<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start != puVar1) {
      this_00 = (default_delete<XrSdkSessionLabel> *)(puVar1 + -1);
      (label_vec->
      super__Vector_base<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)this_00;
      __ptr_00 = puVar1[-1]._M_t.
                 super___uniq_ptr_impl<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_XrSdkSessionLabel_*,_std::default_delete<XrSdkSessionLabel>_>
                 .super__Head_base<0UL,_XrSdkSessionLabel_*,_false>._M_head_impl;
      if (__ptr_00 != (XrSdkSessionLabel *)0x0) {
        std::default_delete<XrSdkSessionLabel>::operator()(this_00,__ptr_00);
      }
      *(undefined8 *)this_00 = 0;
    }
  }
  return;
}

Assistant:

void DebugUtilsData::EndLabelRegion(XrSession session) {
    XrSdkSessionLabelList* vec_ptr = GetSessionLabelList(session);
    if (vec_ptr == nullptr) {
        return;
    }

    // Individual labels do not stay around in the transition out of label region
    RemoveIndividualLabel(*vec_ptr);

    // Remove the last label region
    if (!vec_ptr->empty()) {
        vec_ptr->pop_back();
    }
}